

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5f851::MapDrivePlugIn::drawPathFencesOnMap
          (MapDrivePlugIn *this,TerrainMap *map,GCRoute *path)

{
  pointer ppMVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  Vec3 local_78;
  ulong local_68;
  float local_5c;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [24];
  
  local_5c = *(float *)((long)&this->vehicle + 4);
  fStack_54 = (float)*(int *)((long)&(this->vehicles).
                                     super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 4);
  fVar10 = *(float *)&(this->vehicles).
                      super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  fVar9 = local_5c / fStack_54;
  fStack_54 = fVar10 / fStack_54;
  local_78.x = (local_5c - fVar9) * -0.5;
  local_78.z = (fVar10 - fStack_54) * -0.5;
  local_78.y = 0.0;
  if (0 < *(int *)((long)&(this->vehicles).
                          super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4)) {
    local_58 = 0.0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_48._0_16_ = ZEXT416((uint)fVar9);
    local_68 = 0;
    do {
      if (0 < *(int *)((long)&(this->vehicles).
                              super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4)) {
        lVar8 = (long)(int)local_68;
        lVar7 = 0;
        do {
          fVar10 = mapPointToOutside((PolylineSegmentedPathwaySegmentRadii *)map,&local_78);
          if ((0.0 < fVar10) && (fVar10 < 1.0)) {
            lVar4 = *(int *)((long)&(this->vehicles).
                                    super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 4) * lVar8;
            uVar6 = lVar7 + lVar4;
            uVar5 = lVar7 + 0x3f + lVar4;
            if (-1 < (long)uVar6) {
              uVar5 = uVar6;
            }
            ppMVar1 = (this->vehicles).
                      super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage +
                      ((long)uVar5 >> 6) +
                      ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1);
            *ppMVar1 = (MapDriver *)((ulong)*ppMVar1 | 1L << ((byte)uVar6 & 0x3f));
          }
          if (1.0 < fVar10) {
            lVar4 = *(int *)((long)&(this->vehicles).
                                    super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 4) * lVar8;
            uVar6 = lVar7 + lVar4;
            uVar5 = lVar7 + 0x3f + lVar4;
            if (-1 < (long)uVar6) {
              uVar5 = uVar6;
            }
            bVar2 = (byte)uVar6 & 0x3f;
            ppMVar1 = (this->vehicles).
                      super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage +
                      ((long)uVar5 >> 6) +
                      ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1);
            *ppMVar1 = (MapDriver *)
                       ((ulong)*ppMVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2));
          }
          local_78.z = local_78.z + 0.0;
          local_78.x = local_78.x + (float)local_48._0_4_;
          local_78.y = local_78.y + (float)local_48._4_4_;
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 <
                 *(int *)((long)&(this->vehicles).
                                 super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 4));
      }
      local_78.x = local_78.x - local_5c;
      local_78.y = local_78.y + local_58;
      local_78.z = local_78.z + fStack_54;
      uVar3 = (int)local_68 + 1;
      local_68 = (ulong)uVar3;
    } while ((int)uVar3 <
             *(int *)((long)&(this->vehicles).
                             super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4));
  }
  return;
}

Assistant:

void drawPathFencesOnMap (TerrainMap& map, GCRoute& path)
        {
    #ifdef OLDTERRAINMAP
            const float xs = map.xSize / (float)map.resolution;
            const float zs = map.zSize / (float)map.resolution;
            const Vec3 alongRow (xs, 0, 0);
            const Vec3 nextRow (-map.xSize, 0, zs);
            Vec3 g ((map.xSize - xs) / -2, 0, (map.zSize - zs) / -2);
            for (int j = 0; j < map.resolution; j++)
            {
                for (int i = 0; i < map.resolution; i++)
                {
                    const float outside = mapPointToOutside( path, g ); // path.howFarOutsidePath (g);
                    const float wallThickness = 1.0f;

                    // set map cells adjacent to the outside edge of the path
                    if ((outside > 0) && (outside < wallThickness))
                        map.setMapBit (i, j, true);

                    // clear all other off-path map cells 
                    if (outside > wallThickness) map.setMapBit (i, j, false);

                    g += alongRow;
                }
                g += nextRow;
            }
    #else
    #endif
        }